

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  byte *pbVar7;
  uint uVar8;
  int __c;
  uint uVar9;
  char *fmt;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  
  logprintf("      %*s = ",(ulong)(uint)ewidth,e);
  if (p == (char *)0x0) {
    pcVar6 = "NULL\n";
  }
  else {
    logprintf("\"");
    cVar3 = *p;
    if (cVar3 != '\0') {
      pcVar6 = p + 1;
      do {
        switch(cVar3) {
        case '\a':
          __c = 7;
          break;
        case '\b':
          __c = 8;
          break;
        default:
          if ((byte)(cVar3 - 0x20U) < 0x5f) {
            fmt = "%c";
          }
          else {
            fmt = "\\x%02X";
          }
          logprintf(fmt);
          goto LAB_0011b744;
        case '\n':
          __c = 10;
          break;
        case '\r':
          __c = 0xd;
        }
        putchar(__c);
LAB_0011b744:
        cVar3 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while (cVar3 != '\0');
    }
    logprintf("\"");
    sVar4 = strlen(p);
    logprintf(" (length %d)",sVar4 & 0xffffffff);
    pcVar6 = "\n";
    if (utf8 != L'\0') {
      sVar4 = strlen(p);
      logprintf(" [");
      uVar8 = 0;
      pbVar7 = (byte *)p;
      do {
        uVar11 = 0;
        if (sVar4 == 0) {
LAB_0011b809:
          uVar10 = 0;
          uVar9 = uVar11;
        }
        else {
          bVar1 = *pbVar7;
          if (bVar1 == 0) goto LAB_0011b809;
          bVar2 = _utf8_to_unicode_utf8_count[bVar1];
          uVar10 = 0xffffffff;
          uVar9 = 0;
          if (((ulong)(long)(char)bVar2 <= sVar4) && (uVar9 = uVar11, bVar2 - 1 < 4)) {
            switch((uint)bVar2) {
            case 1:
              uVar9 = bVar1 & 0x7f;
              uVar10 = 1;
              break;
            case 2:
              if ((pbVar7[1] & 0xffffffc0) == 0x80) {
                uVar9 = pbVar7[1] & 0x3f | (bVar1 & 0x1f) << 6;
                uVar10 = 2;
              }
              break;
            case 3:
              if (((((int)(char)pbVar7[1] & 0xc0U) == 0x80) && ((pbVar7[2] & 0xffffffc0) == 0x80))
                 && (uVar5 = ((int)(char)pbVar7[1] & 0x3fU) << 6 | (bVar1 & 0xf) << 0xc,
                    0x7ff < uVar5)) {
                uVar9 = pbVar7[2] & 0x3f | uVar5;
LAB_0011b88c:
                bVar12 = 0x10ffff < uVar9;
                if (bVar12) {
                  uVar9 = 0;
                }
                uVar11 = (uint)(char)bVar2;
                if (bVar12) {
                  uVar11 = 0xffffffff;
                }
                uVar10 = (ulong)uVar11;
              }
              break;
            case 4:
              if ((((3 < sVar4) && (((int)(char)pbVar7[1] & 0xc0U) == 0x80)) &&
                  (((int)(char)pbVar7[2] & 0xc0U) == 0x80)) &&
                 (((pbVar7[3] & 0xffffffc0) == 0x80 &&
                  (uVar5 = ((int)(char)pbVar7[1] & 0x3fU) << 0xc | (bVar1 & 7) << 0x12,
                  0xffff < uVar5)))) {
                uVar9 = pbVar7[3] & 0x3f | ((int)(char)pbVar7[2] & 0x3fU) << 6 | uVar5;
                goto LAB_0011b88c;
              }
            }
          }
        }
        if ((int)uVar10 < 1) goto LAB_0011b95b;
        if (pbVar7 != (byte *)p) {
          logprintf(" ");
        }
        logprintf("%04X",(ulong)uVar9);
        pbVar7 = pbVar7 + uVar10;
        sVar4 = sVar4 - uVar10;
        uVar8 = uVar8 + 1;
      } while( true );
    }
  }
LAB_0011b9ad:
  logprintf(pcVar6);
  return;
LAB_0011b95b:
  logprintf("]");
  logprintf(" (count %d",(ulong)uVar8);
  if ((int)uVar10 < 0) {
    logprintf(",unknown %d bytes",sVar4);
  }
  logprintf(")");
  pcVar6 = "\n";
  goto LAB_0011b9ad;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': printf("\a"); break;
		case '\b': printf("\b"); break;
		case '\n': printf("\n"); break;
		case '\r': printf("\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %d bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}